

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O1

bool P_IsBuildMap(MapData *map)

{
  FileReader *pFVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int *piVar5;
  bool bVar6;
  
  pFVar1 = map->MapLumps[0].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)pFVar1->Length;
  }
  if (uVar4 < 4) {
    bVar6 = false;
  }
  else {
    piVar5 = (int *)operator_new__((ulong)uVar4);
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    pFVar1 = map->MapLumps[0].Reader;
    lVar3 = pFVar1->Length;
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,piVar5,(long)(int)lVar3);
    bVar6 = true;
    if (*piVar5 != 0x1a4d4c42) {
      iVar2 = (int)((ulong)*(ushort *)(piVar5 + 5) * 0x28);
      bVar6 = false;
      if (((iVar2 + 0x1aU <= uVar4) && (bVar6 = false, *piVar5 == 7)) &&
         ((uint)*(ushort *)((long)piVar5 + (ulong)*(ushort *)(piVar5 + 5) * 0x28 + 0x16) * 0x20 +
          iVar2 + 0x18 <= uVar4)) {
        bVar6 = *(ushort *)(piVar5 + 4) < 0x800;
      }
    }
    operator_delete__(piVar5);
  }
  return bVar6;
}

Assistant:

bool P_IsBuildMap(MapData *map)
{
	DWORD len = map->Size(ML_LABEL);
	if (len < 4)
	{
		return false;
	}
	BYTE *data = new BYTE[len];

	map->Seek(ML_LABEL);
	map->Read(ML_LABEL, data);

	// Check for a Blood map.
	if (*(DWORD *)data == MAKE_ID('B','L','M','\x1a'))
	{
		delete[] data;
		return true;
	}

	const int numsec = LittleShort(*(WORD *)(data + 20));
	int numwalls;

	if (len < 26 + numsec*sizeof(sectortype) ||
		(numwalls = LittleShort(*(WORD *)(data + 22 + numsec*sizeof(sectortype))),
			len < 24 + numsec*sizeof(sectortype) + numwalls*sizeof(walltype)) ||
		LittleLong(*(DWORD *)data) != 7 ||
		LittleShort(*(WORD *)(data + 16)) >= 2048)
	{ // Can't possibly be a version 7 BUILD map
		delete[] data;
		return false;
	}
	delete[] data;
	return true;
}